

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_panel.cxx
# Opt level: O1

void refreshUI(void)

{
  Fl_Menu_Item *pFVar1;
  long lVar2;
  
  pFVar1 = (wUserOrSystem->super_Fl_Menu_).value_;
  if (pFVar1 == (Fl_Menu_Item *)0x0) {
    lVar2 = -1;
  }
  else {
    lVar2 = (long)((int)((ulong)((long)pFVar1 - (long)(wUserOrSystem->super_Fl_Menu_).menu_) >> 3) *
                  -0x49249249);
  }
  Fl_Choice::value(wVisibleFocus,opt[1][lVar2]);
  Fl_Choice::value(wArrowFocus,opt[0][lVar2]);
  Fl_Choice::value(wShowTooltips,opt[3][lVar2]);
  Fl_Choice::value(wDNDText,opt[2][lVar2]);
  Fl_Choice::value(wGTKText,opt[4][lVar2]);
  return;
}

Assistant:

static void refreshUI() {
  int mode = wUserOrSystem->value();
  wVisibleFocus->value(opt[Fl::OPTION_VISIBLE_FOCUS][mode]);
  wArrowFocus->value(opt[Fl::OPTION_ARROW_FOCUS][mode]);
  wShowTooltips->value(opt[Fl::OPTION_SHOW_TOOLTIPS][mode]);
  wDNDText->value(opt[Fl::OPTION_DND_TEXT][mode]);
  wGTKText->value(opt[Fl::OPTION_FNFC_USES_GTK][mode]);
}